

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  uchar *__ptr;
  uint uVar1;
  size_t buffersize;
  uchar *buffer;
  size_t local_40;
  uchar *local_38;
  
  local_38 = (uchar *)0x0;
  uVar1 = lodepng_load_file(&local_38,&local_40,filename);
  __ptr = local_38;
  if (uVar1 == 0) {
    uVar1 = lodepng_decode_memory(out,w,h,local_38,local_40,colortype,bitdepth);
  }
  free(__ptr);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
                             LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned char* buffer = 0;
  size_t buffersize;
  unsigned error;
  error = lodepng_load_file(&buffer, &buffersize, filename);
  if(!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
  lodepng_free(buffer);
  return error;
}